

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::recursive_copy_skip(xml_node *dest,xml_node *source,xml_node *skip)

{
  xml_attribute xVar1;
  int iVar2;
  int iVar3;
  char_t *pcVar4;
  char *pcVar5;
  xml_attribute_struct *pxVar6;
  xml_node_struct *pxVar7;
  xml_node cc;
  xml_node local_38;
  xml_node local_30;
  
  iVar2 = 0;
  iVar3 = 0;
  if (dest->_root != (xml_node_struct *)0x0) {
    iVar3 = ((uint)dest->_root->header & 7) + 1;
  }
  pxVar7 = source->_root;
  if (pxVar7 != (xml_node_struct *)0x0) {
    iVar2 = ((uint)pxVar7->header & 7) + 1;
  }
  if (iVar3 != iVar2) {
    __assert_fail("dest.type() == source.type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0xca0,
                  "void pugi::impl::(anonymous namespace)::recursive_copy_skip(xml_node &, const xml_node &, const xml_node &)"
                 );
  }
  if (pxVar7 == (xml_node_struct *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = ((uint)pxVar7->header & 7) + 1;
  }
  switch(iVar2) {
  case 2:
    if (pxVar7 == (xml_node_struct *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = "";
      if (pxVar7->name != (char_t *)0x0) {
        pcVar5 = pxVar7->name;
      }
    }
    xml_node::set_name(dest,pcVar5);
    if (source->_root == (xml_node_struct *)0x0) {
      pxVar6 = (xml_attribute_struct *)0x0;
    }
    else {
      pxVar6 = source->_root->first_attribute;
    }
    for (; pxVar6 != (xml_attribute_struct *)0x0; pxVar6 = pxVar6->next_attribute) {
      pcVar4 = pxVar6->name;
      if (pcVar4 == (char_t *)0x0) {
        pcVar4 = "";
      }
      xVar1 = xml_node::append_attribute(dest,pcVar4);
      if (xVar1._attr != (xml_attribute_struct *)0x0) {
        pcVar4 = pxVar6->value;
        if (pcVar4 == (char_t *)0x0) {
          pcVar4 = "";
        }
        strcpy_insitu(&(xVar1._attr)->value,&(xVar1._attr)->header,8,pcVar4);
      }
    }
    if (source->_root == (xml_node_struct *)0x0) {
      pxVar7 = (xml_node_struct *)0x0;
    }
    else {
      pxVar7 = source->_root->first_child;
    }
    if (pxVar7 != (xml_node_struct *)0x0) {
      do {
        if (pxVar7 != skip->_root) {
          local_38._root = pxVar7;
          local_30 = xml_node::append_child(dest,((uint)pxVar7->header & 7) + node_document);
          if (local_30._root == (xml_node_struct *)0x0) {
            __assert_fail("cc",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                          ,0xcb0,
                          "void pugi::impl::(anonymous namespace)::recursive_copy_skip(xml_node &, const xml_node &, const xml_node &)"
                         );
          }
          recursive_copy_skip(&local_30,&local_38,skip);
        }
        pxVar7 = pxVar7->next_sibling;
      } while (pxVar7 != (xml_node_struct *)0x0);
    }
    break;
  case 3:
  case 4:
  case 5:
  case 8:
    if (pxVar7 == (xml_node_struct *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = "";
      if (pxVar7->value != (char_t *)0x0) {
        pcVar5 = pxVar7->value;
      }
    }
    goto LAB_00114c10;
  case 6:
    pcVar5 = "";
    if (pxVar7 != (xml_node_struct *)0x0) {
      pcVar5 = "";
      if (pxVar7->name != (char_t *)0x0) {
        pcVar5 = pxVar7->name;
      }
    }
    xml_node::set_name(dest,pcVar5);
    pcVar5 = "";
    if (source->_root != (xml_node_struct *)0x0) {
      pcVar4 = source->_root->value;
      pcVar5 = "";
      if (pcVar4 != (char_t *)0x0) {
        pcVar5 = pcVar4;
      }
    }
LAB_00114c10:
    xml_node::set_value(dest,pcVar5);
    return;
  case 7:
    if (pxVar7 == (xml_node_struct *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = "";
      if (pxVar7->name != (char_t *)0x0) {
        pcVar5 = pxVar7->name;
      }
    }
    xml_node::set_name(dest,pcVar5);
    if (source->_root == (xml_node_struct *)0x0) {
      pxVar6 = (xml_attribute_struct *)0x0;
    }
    else {
      pxVar6 = source->_root->first_attribute;
    }
    for (; pxVar6 != (xml_attribute_struct *)0x0; pxVar6 = pxVar6->next_attribute) {
      pcVar4 = pxVar6->name;
      if (pcVar4 == (char_t *)0x0) {
        pcVar4 = "";
      }
      xVar1 = xml_node::append_attribute(dest,pcVar4);
      if (xVar1._attr != (xml_attribute_struct *)0x0) {
        pcVar4 = pxVar6->value;
        if (pcVar4 == (char_t *)0x0) {
          pcVar4 = "";
        }
        strcpy_insitu(&(xVar1._attr)->value,&(xVar1._attr)->header,8,pcVar4);
      }
    }
    break;
  default:
    __assert_fail("!\"Invalid node type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0xccf,
                  "void pugi::impl::(anonymous namespace)::recursive_copy_skip(xml_node &, const xml_node &, const xml_node &)"
                 );
  }
  return;
}

Assistant:

PUGI__FN void recursive_copy_skip(xml_node& dest, const xml_node& source, const xml_node& skip)
	{
		assert(dest.type() == source.type());

		switch (source.type())
		{
		case node_element:
		{
			dest.set_name(source.name());

			for (xml_attribute a = source.first_attribute(); a; a = a.next_attribute())
				dest.append_attribute(a.name()).set_value(a.value());

			for (xml_node c = source.first_child(); c; c = c.next_sibling())
			{
				if (c == skip) continue;

				xml_node cc = dest.append_child(c.type());
				assert(cc);

				recursive_copy_skip(cc, c, skip);
			}

			break;
		}

		case node_pcdata:
		case node_cdata:
		case node_comment:
		case node_doctype:
			dest.set_value(source.value());
			break;

		case node_pi:
			dest.set_name(source.name());
			dest.set_value(source.value());
			break;

		case node_declaration:
		{
			dest.set_name(source.name());

			for (xml_attribute a = source.first_attribute(); a; a = a.next_attribute())
				dest.append_attribute(a.name()).set_value(a.value());

			break;
		}

		default:
			assert(!"Invalid node type");
		}
	}